

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

void __thiscall
amrex::TagBoxArray::collate(TagBoxArray *this,PinnedVector<IntVect> *TheGlobalCollateSpace)

{
  PinnedVector<IntVect> TheLocalCollateSpace;
  Long numtags;
  PinnedVector<IntVect> local_28;
  size_type local_10;
  
  local_28.m_data = (pointer)0x0;
  local_28.m_size = 0;
  local_28.m_capacity = 0;
  local_collate_cpu(this,&local_28);
  local_10 = local_28.m_size;
  ParallelDescriptor::ReduceLongSum((Long *)&local_10);
  if (local_10 == 0) {
    TheGlobalCollateSpace->m_size = 0;
  }
  else {
    if (0x7fffffff < (long)local_10) {
      Abort_host(
                "TagBoxArray::collate: Too many tags. Using a larger blocking factor might help. Please file an issue on github"
                );
    }
    operator_delete(TheGlobalCollateSpace->m_data,TheGlobalCollateSpace->m_capacity * 0xc);
    TheGlobalCollateSpace->m_data = local_28.m_data;
    TheGlobalCollateSpace->m_size = local_28.m_size;
    TheGlobalCollateSpace->m_capacity = local_28.m_capacity;
    local_28.m_data = (pointer)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
  }
  if (local_28.m_data != (pointer)0x0) {
    operator_delete(local_28.m_data,local_28.m_capacity * 0xc);
  }
  return;
}

Assistant:

void
TagBoxArray::collate (Gpu::PinnedVector<IntVect>& TheGlobalCollateSpace) const
{
    BL_PROFILE("TagBoxArray::collate()");

    Gpu::PinnedVector<IntVect> TheLocalCollateSpace;
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        local_collate_gpu(TheLocalCollateSpace);
    } else
#endif
    {
        local_collate_cpu(TheLocalCollateSpace);
    }

    Long count = TheLocalCollateSpace.size();

    //
    // The total number of tags system wide that must be collated.
    //
    Long numtags = count;
    ParallelDescriptor::ReduceLongSum(numtags);

    if (numtags == 0) {
        TheGlobalCollateSpace.clear();
        return;
    } else if (numtags > static_cast<Long>(std::numeric_limits<int>::max())) {
        // xxxxx todo
        amrex::Abort("TagBoxArray::collate: Too many tags. Using a larger blocking factor might help. Please file an issue on github");
    }

#ifdef BL_USE_MPI
    //
    // On I/O proc. this holds all tags after they've been gather'd.
    // On other procs. non-mempty signals size is not zero.
    //
    if (ParallelDescriptor::IOProcessor()) {
        TheGlobalCollateSpace.resize(numtags);
    } else {
        TheGlobalCollateSpace.resize(1);
    }

    //
    // Tell root CPU how many tags each CPU will be sending.
    //
    const int IOProcNumber = ParallelDescriptor::IOProcessorNumber();
    const std::vector<int>& countvec = ParallelDescriptor::Gather(static_cast<int>(count),
                                                                  IOProcNumber);
    std::vector<int> offset(countvec.size(),0);
    if (ParallelDescriptor::IOProcessor()) {
        for (int i = 1, N = offset.size(); i < N; i++) {
            offset[i] = offset[i-1] + countvec[i-1];
        }
    }
    //
    // Gather all the tags to IOProcNumber into TheGlobalCollateSpace.
    //
    const IntVect* psend = (count > 0) ? TheLocalCollateSpace.data() : nullptr;
    IntVect* precv = TheGlobalCollateSpace.data();

    // Issues have been observed with the following call at very large scale when using
    // FujitsuMPI. The issue seems to be related to the use of MPI_Datatype. We can
    // bypasses the issue by exchanging simpler integer arrays.
#if !(defined(__FUJITSU) || defined(__CLANG_FUJITSU))
    ParallelDescriptor::Gatherv(psend, count, precv, countvec, offset, IOProcNumber);
#else
    const int* psend_int = psend->begin();
    int* precv_int = precv->begin();
    Long count_int = count * AMREX_SPACEDIM;
    auto countvec_int = std::vector<int>(countvec.size());
    auto offset_int = std::vector<int>(offset.size());
    const auto mul_funct = [](const auto el){return el*AMREX_SPACEDIM;};
    std::transform(countvec.begin(), countvec.end(), countvec_int.begin(), mul_funct);
    std::transform(offset.begin(), offset.end(), offset_int.begin(), mul_funct);
    ParallelDescriptor::Gatherv(
        psend_int, count_int, precv_int, countvec_int, offset_int, IOProcNumber);
#endif

#else
    TheGlobalCollateSpace = std::move(TheLocalCollateSpace);
#endif
}